

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

void __thiscall Tokenizer::get_tokens(Tokenizer *this)

{
  bool bVar1;
  long *plVar2;
  size_type sVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  int local_15c;
  undefined1 local_158 [4];
  int space_ascii;
  char comment_data [256];
  undefined1 local_50 [7];
  char character;
  string meta_string;
  string token;
  Tokenizer *this_local;
  
  std::__cxx11::string::string((string *)(meta_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_50);
  local_15c = 0x20;
  while( true ) {
    plVar2 = (long *)std::istream::get((char *)this->file_stream);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    if ((((comment_data[0xff] != '\n') && (comment_data[0xff] != '\t')) &&
        (comment_data[0xff] != '\r')) &&
       ((sVar3 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::count(&this->symbol_map,comment_data + 0xff), sVar3 == 0 ||
        (bVar1 = tokenize_symbol(this,comment_data[0xff],(string *)((long)&meta_string.field_2 + 8),
                                 (string *)local_50), !bVar1)))) {
      bVar1 = is_string(comment_data[0xff],(string *)local_50,
                        (string *)((long)&meta_string.field_2 + 8));
      if (bVar1) {
        uVar4 = std::__cxx11::string::empty();
        if (((uVar4 & 1) == 0) && (comment_data[0xff] == '\"')) {
          std::operator+(&local_190,"0",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          std::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push(&this->token_queue,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::operator=((string *)local_50,"");
        }
        else if (comment_data[0xff] == '\"') {
          std::istream::get((char *)this->file_stream);
          std::__cxx11::string::operator+=((string *)local_50,comment_data[0xff]);
        }
        else {
          std::__cxx11::string::operator+=((string *)local_50,comment_data[0xff]);
        }
      }
      else {
        bVar1 = is_singleline_comment(comment_data[0xff],(string *)((long)&meta_string.field_2 + 8))
        ;
        if (bVar1) {
          std::istream::getline((char *)this->file_stream,(long)local_158);
          std::__cxx11::string::operator=((string *)(meta_string.field_2._M_local_buf + 8),"");
        }
        else {
          bVar1 = is_multiline_comment
                            (comment_data[0xff],(string *)((long)&meta_string.field_2 + 8));
          if (bVar1) {
            bVar1 = is_multiline_end(comment_data[0xff],(string *)((long)&meta_string.field_2 + 8));
            if (bVar1) {
              std::__cxx11::string::operator=((string *)(meta_string.field_2._M_local_buf + 8),"");
            }
            else {
              std::__cxx11::string::operator+=
                        ((string *)(meta_string.field_2._M_local_buf + 8),comment_data[0xff]);
            }
          }
          else if (comment_data[0xff] == local_15c) {
            uVar4 = std::__cxx11::string::empty();
            if ((uVar4 & 1) == 0) {
              std::
              queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push(&this->token_queue,(value_type *)((long)&meta_string.field_2 + 8));
            }
            std::__cxx11::string::operator=((string *)(meta_string.field_2._M_local_buf + 8),"");
          }
          else {
            std::__cxx11::string::operator+=
                      ((string *)(meta_string.field_2._M_local_buf + 8),comment_data[0xff]);
          }
        }
      }
    }
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(meta_string.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Tokenizer::get_tokens() {
    std::string token;
    // holds strings within text
    std::string meta_string;
    char character;
    char comment_data[256];
    int space_ascii = 32;

    while (file_stream.get(character)) {
        if (character == '\n' || character == '\t' || character == '\r')
            continue;

       if (symbol_map.count(character) > 0) {
            if (tokenize_symbol(character, token, meta_string)) {
                continue;
            }
        }

        if (!is_string(character, meta_string, token)) {
            if (is_singleline_comment(character, token)) {
                file_stream.getline(comment_data, 256);
                token = "";
                continue;
            }
            else if (is_multiline_comment(character, token)) {
                if (!is_multiline_end(character, token)) {
                    token += character;
                    continue;
                }
                token = "";
            }

            else if (static_cast<int>(character) == space_ascii) {
                if (!token.empty()) {
                    token_queue.push(token);
                }
                token = "";
            }
            else {
                token += character;
            }
        }
        else if ((!meta_string.empty() && character == '"')) {
            token_queue.push("0"+meta_string);
            meta_string = "";
        }
        else {
            if (character == '"')
            {
                // dont store quotation marks in string but include the next character
                file_stream.get(character);
                meta_string += character;
            }
            else {
                meta_string += character;
            }
        }
    }
    file_stream.close();
}